

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

CFGNode * __thiscall
dxil_spv::CFGStructurizer::get_or_create_ladder_block
          (CFGStructurizer *this,CFGNode *node,size_t header_index)

{
  CFGNode *header_00;
  reference ppCVar1;
  CFGNode *pCVar2;
  CFGNode *ladder;
  CFGNode *loop_ladder;
  CFGNode *header;
  size_t header_index_local;
  CFGNode *node_local;
  CFGStructurizer *this_local;
  
  ppCVar1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            operator[](&node->headers,header_index);
  header_00 = *ppCVar1;
  ladder = header_00->loop_ladder_block;
  if (ladder == (CFGNode *)0x0) {
    pCVar2 = create_ladder_block(this,header_00,node,".merge");
    header_00->loop_ladder_block = pCVar2;
    if (1 < header_index) {
      ladder = header_00->loop_ladder_block;
    }
  }
  return ladder;
}

Assistant:

CFGNode *CFGStructurizer::get_or_create_ladder_block(CFGNode *node, size_t header_index)
{
	auto *header = node->headers[header_index];
	auto *loop_ladder = header->loop_ladder_block;

	if (!loop_ladder)
	{
		// We don't have a ladder, because the loop merged to an outer scope, so we need to fake a ladder.
		// If we hit this case, we did not hit the simpler case in find_loops().
		auto *ladder = create_ladder_block(header, node, ".merge");
		header->loop_ladder_block = ladder;

		// If this is the second outermost scope, we don't need to deal with ladders.
		// ladder is a dummy branch straight out to the outer merge point.
		if (header_index > 1)
			loop_ladder = header->loop_ladder_block;
	}

	return loop_ladder;
}